

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_coding.cc
# Opt level: O2

void anon_unknown.dwarf_ba46::Encode
               (Node *node,string *code,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *codewords)

{
  Node *pNVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  if (node != (Node *)0x0) {
    if (-1 < (long)node->symbol_) {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((codewords->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + node->symbol_));
      return;
    }
    pNVar1 = node->left_;
    std::operator+(&bStack_48,code,"0");
    Encode(pNVar1,&bStack_48,codewords);
    std::__cxx11::string::~string((string *)&bStack_48);
    pNVar1 = node->right_;
    std::operator+(&bStack_48,code,"1");
    Encode(pNVar1,&bStack_48,codewords);
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  return;
}

Assistant:

void Encode(const Node* node, const std::string& code,
            std::vector<std::string>* codewords) {
  if (NULL == node) return;

  const int symbol(node->GetSymbol());
  if (0 <= symbol) {
    (*codewords)[symbol] = code;
  } else {
    Encode(node->GetLeft(), code + "0", codewords);
    Encode(node->GetRight(), code + "1", codewords);
  }
}